

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O3

void __thiscall
Assimp::MD5Importer::InternReadFile
          (MD5Importer *this,string *pFile,aiScene *_pScene,IOSystem *_pIOHandler)

{
  pointer pcVar1;
  aiNode *paVar2;
  int iVar3;
  long lVar4;
  runtime_error *prVar5;
  string extension;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->pIOHandler = _pIOHandler;
  this->pScene = _pScene;
  this->bHadMD5Camera = false;
  this->bHadMD5Mesh = false;
  this->bHadMD5Anim = false;
  lVar4 = std::__cxx11::string::rfind((char)pFile,0x2e);
  if (lVar4 == -1) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar1 = (pFile->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + pFile->_M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)pFile);
  }
  std::__cxx11::string::_M_assign((string *)&this->mFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  BaseImporter::GetExtension(&local_70,pFile);
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar3 == 0) {
    LoadMD5CameraFile(this);
    goto LAB_00467622;
  }
  if (this->configNoAutoLoad == false) {
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar3 == 0) goto LAB_004675d0;
    LoadMD5MeshFile(this);
  }
  else {
LAB_004675d0:
    if (local_70._M_string_length == 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Failure, need file extension to determine MD5 part type","");
      std::runtime_error::runtime_error(prVar5,(string *)local_50);
      *(undefined ***)prVar5 = &PTR__runtime_error_0080bf48;
      __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar3 == 0) {
        LoadMD5MeshFile(this);
      }
      goto LAB_00467622;
    }
  }
  LoadMD5AnimFile(this);
LAB_00467622:
  if (((this->bHadMD5Mesh == false) && (this->bHadMD5Anim == false)) &&
     (this->bHadMD5Camera == false)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to read valid contents out of this MD5* file","");
    std::runtime_error::runtime_error(prVar5,(string *)local_50);
    *(undefined ***)prVar5 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar2 = this->pScene->mRootNode;
  (paVar2->mTransformation).a1 = 1.0;
  (paVar2->mTransformation).a2 = 0.0;
  (paVar2->mTransformation).a3 = 0.0;
  (paVar2->mTransformation).a4 = 0.0;
  (paVar2->mTransformation).b1 = 0.0;
  (paVar2->mTransformation).b2 = 0.0;
  (paVar2->mTransformation).b3 = 1.0;
  (paVar2->mTransformation).b4 = 0.0;
  (paVar2->mTransformation).c1 = 0.0;
  (paVar2->mTransformation).c2 = -1.0;
  (paVar2->mTransformation).c3 = 0.0;
  (paVar2->mTransformation).c4 = 0.0;
  (paVar2->mTransformation).d1 = 0.0;
  (paVar2->mTransformation).d2 = 0.0;
  (paVar2->mTransformation).d3 = 0.0;
  (paVar2->mTransformation).d4 = 1.0;
  if (this->bHadMD5Mesh == false) {
    this->pScene->mFlags = this->pScene->mFlags | 1;
  }
  if (this->mBuffer != (char *)0x0) {
    operator_delete__(this->mBuffer);
  }
  this->mBuffer = (char *)0x0;
  this->fileSize = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MD5Importer::InternReadFile( const std::string& pFile,
                                 aiScene* _pScene, IOSystem* _pIOHandler)
{
    pIOHandler = _pIOHandler;
    pScene     = _pScene;
    bHadMD5Mesh = bHadMD5Anim = bHadMD5Camera = false;

    // remove the file extension
    const std::string::size_type pos = pFile.find_last_of('.');
    mFile = (std::string::npos == pos ? pFile : pFile.substr(0,pos+1));

    const std::string extension = GetExtension(pFile);
    try {
        if (extension == "md5camera") {
            LoadMD5CameraFile();
        }
        else if (configNoAutoLoad || extension == "md5anim") {
            // determine file extension and process just *one* file
            if (extension.length() == 0) {
                throw DeadlyImportError("Failure, need file extension to determine MD5 part type");
            }
            if (extension == "md5anim") {
                LoadMD5AnimFile();
            }
            else if (extension == "md5mesh") {
                LoadMD5MeshFile();
            }
        }
        else {
            LoadMD5MeshFile();
            LoadMD5AnimFile();
        }
    }
    catch ( ... ) { // std::exception, Assimp::DeadlyImportError
        UnloadFileFromMemory();
        throw;
    }

    // make sure we have at least one file
    if (!bHadMD5Mesh && !bHadMD5Anim && !bHadMD5Camera) {
        throw DeadlyImportError("Failed to read valid contents out of this MD5* file");
    }

    // Now rotate the whole scene 90 degrees around the x axis to match our internal coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);

    // the output scene wouldn't pass the validation without this flag
    if (!bHadMD5Mesh) {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }

    // clean the instance -- the BaseImporter instance may be reused later.
    UnloadFileFromMemory();
}